

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuspendingcall.cpp
# Opt level: O3

void __thiscall
QDBusPendingCallWatcher::QDBusPendingCallWatcher
          (QDBusPendingCallWatcher *this,QDBusPendingCall *call,QObject *parent)

{
  __pointer_type pQVar1;
  MessageType MVar2;
  QObject *this_00;
  QDBusPendingCallPrivate *pQVar3;
  QMutex *pQVar4;
  long in_FS_OFFSET;
  bool bVar5;
  code *local_48;
  undefined8 local_40;
  QMetaMethodReturnArgument local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject(&this->super_QObject,parent);
  pQVar3 = (call->d).d.ptr;
  (this->super_QDBusPendingCall).d.d.ptr = pQVar3;
  if (pQVar3 != (QDBusPendingCallPrivate *)0x0) {
    LOCK();
    (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
    pQVar3 = (this->super_QDBusPendingCall).d.d.ptr;
  }
  *(undefined ***)this = &PTR_metaObject_001beed0;
  if (pQVar3 == (QDBusPendingCallPrivate *)0x0) goto LAB_00186d49;
  pQVar4 = &pQVar3->mutex;
  if ((pQVar3->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar5 = (pQVar4->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar5) {
      (pQVar4->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar5) goto LAB_00186ca0;
  }
  else {
LAB_00186ca0:
    QBasicMutex::lockInternal();
  }
  pQVar3 = (this->super_QDBusPendingCall).d.d.ptr;
  if (pQVar3->watcherHelper == (QDBusPendingCallWatcherHelper *)0x0) {
    this_00 = (QObject *)operator_new(0x10);
    QObject::QObject(this_00,(QObject *)0x0);
    *(undefined ***)this_00 = &PTR_metaObject_001bf008;
    pQVar3 = (this->super_QDBusPendingCall).d.d.ptr;
    pQVar3->watcherHelper = (QDBusPendingCallWatcherHelper *)this_00;
    MVar2 = QDBusMessage::type(&pQVar3->replyMessage);
    pQVar3 = (this->super_QDBusPendingCall).d.d.ptr;
    if (MVar2 != InvalidMessage) {
      local_48 = QDBusPendingCallWatcherHelper::finished;
      local_40 = 0;
      local_38.metaType = &QtPrivate::QMetaTypeInterfaceWrapper<void>::metaType;
      local_38.name = (char *)0x0;
      local_38.data = (void *)0x0;
      QMetaObject::invokeMethodCallableHelper<void(QDBusPendingCallWatcherHelper::*)()>
                (pQVar3->watcherHelper,(offset_in_QDBusPendingCallWatcherHelper_to_subr *)&local_48,
                 QueuedConnection,&local_38);
      pQVar3 = (this->super_QDBusPendingCall).d.d.ptr;
    }
  }
  QDBusPendingCallWatcherHelper::add(pQVar3->watcherHelper,this);
  LOCK();
  pQVar1 = (pQVar4->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (pQVar4->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar1 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(pQVar4);
  }
LAB_00186d49:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QDBusPendingCallWatcher::QDBusPendingCallWatcher(const QDBusPendingCall &call, QObject *parent)
    : QObject(parent), QDBusPendingCall(call)
{
    if (d) {                    // QDBusPendingCall::d
        const auto locker = qt_scoped_lock(d->mutex);
        if (!d->watcherHelper) {
            d->watcherHelper = new QDBusPendingCallWatcherHelper;
            if (d->replyMessage.type() != QDBusMessage::InvalidMessage) {
                // cause a signal emission anyways
                QMetaObject::invokeMethod(d->watcherHelper,
                                          &QDBusPendingCallWatcherHelper::finished,
                                          Qt::QueuedConnection);
            }
        }
        d->watcherHelper->add(this);
    }
}